

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.cpp
# Opt level: O0

EndsWithMatcher * Catch::Matchers::EndsWith(string *str,CaseSensitive caseSensitivity)

{
  CasedString *in_RDI;
  CasedString *comparator;
  EndsWithMatcher *in_stack_ffffffffffffffb0;
  CasedString local_40;
  
  comparator = &local_40;
  CasedString::CasedString(in_RDI,(string *)in_RDI,Yes);
  EndsWithMatcher::EndsWithMatcher(in_stack_ffffffffffffffb0,comparator);
  CasedString::~CasedString((CasedString *)0x19b0e1);
  return (EndsWithMatcher *)in_RDI;
}

Assistant:

EndsWithMatcher EndsWith( std::string const& str, CaseSensitive caseSensitivity ) {
        return EndsWithMatcher( CasedString( str, caseSensitivity) );
    }